

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_column_data_scan.cpp
# Opt level: O2

InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
duckdb::PhysicalColumnDataScan::ParamsToString_abi_cxx11_
          (InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,PhysicalColumnDataScan *this)

{
  PhysicalOperatorType PVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  idx_t params;
  string *this_00;
  allocator local_9a;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->map_idx)._M_h._M_buckets =
       &(__return_storage_ptr__->map_idx)._M_h._M_single_bucket;
  (__return_storage_ptr__->map_idx)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->map_idx)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->map_idx)._M_h._M_element_count = 0;
  (__return_storage_ptr__->map_idx)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->map_idx)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->map_idx)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  PVar1 = (this->super_PhysicalOperator).type;
  if (PVar1 - 0x19 < 3) {
    ::std::__cxx11::string::string((string *)&local_58,"%llu",&local_99);
    Exception::ConstructMessage<unsigned_long>(&local_78,&local_58,this->cte_index);
    ::std::__cxx11::string::string((string *)&local_98,"CTE Index",&local_9a);
    pbVar2 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[](__return_storage_ptr__,&local_98);
    ::std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_98);
    ::std::__cxx11::string::~string((string *)&local_78);
    this_00 = &local_58;
  }
  else {
    if ((PVar1 != DELIM_SCAN) || ((this->delim_index).index == 0xffffffffffffffff))
    goto LAB_009e9d86;
    ::std::__cxx11::string::string((string *)&local_38,"%llu",&local_99);
    params = optional_idx::GetIndex(&this->delim_index);
    Exception::ConstructMessage<unsigned_long>(&local_78,&local_38,params);
    ::std::__cxx11::string::string((string *)&local_98,"Delim Index",&local_9a);
    pbVar2 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[](__return_storage_ptr__,&local_98);
    ::std::__cxx11::string::operator=((string *)pbVar2,(string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_98);
    ::std::__cxx11::string::~string((string *)&local_78);
    this_00 = &local_38;
  }
  ::std::__cxx11::string::~string((string *)this_00);
LAB_009e9d86:
  PhysicalOperator::SetEstimatedCardinality
            (__return_storage_ptr__,(this->super_PhysicalOperator).estimated_cardinality);
  return __return_storage_ptr__;
}

Assistant:

InsertionOrderPreservingMap<string> PhysicalColumnDataScan::ParamsToString() const {
	InsertionOrderPreservingMap<string> result;
	switch (type) {
	case PhysicalOperatorType::DELIM_SCAN:
		if (delim_index.IsValid()) {
			result["Delim Index"] = StringUtil::Format("%llu", delim_index.GetIndex());
		}
		break;
	case PhysicalOperatorType::RECURSIVE_RECURRING_CTE_SCAN:
	case PhysicalOperatorType::CTE_SCAN:
	case PhysicalOperatorType::RECURSIVE_CTE_SCAN: {
		result["CTE Index"] = StringUtil::Format("%llu", cte_index);
		break;
	}
	default:
		break;
	}
	SetEstimatedCardinality(result, estimated_cardinality);
	return result;
}